

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O2

SUNAdaptController SUNAdaptController_PI(SUNContext_conflict sunctx)

{
  undefined8 *puVar1;
  SUNAdaptController p_Var2;
  
  p_Var2 = SUNAdaptController_Soderlind(sunctx);
  puVar1 = (undefined8 *)p_Var2->content;
  *puVar1 = 0x3fe999999999999a;
  puVar1[1] = 0xbfd3d70a3d70a3d7;
  puVar1[4] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined4 *)((long)puVar1 + 0x54) = 1;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_PI(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C = SUNAdaptController_Soderlind(sunctx);
  SUNCheckLastErrNull();

  SUNCheckCallNull(
    SUNAdaptController_SetParams_PI(C, DEFAULT_PI_K1, DEFAULT_PI_K2));

  return (C);
}